

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_rea.c
# Opt level: O3

int tool_readbusy_cb(void *clientp,curl_off_t dltotal,curl_off_t dlnow,curl_off_t ultotal,
                    curl_off_t ulnow)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  timeval newer;
  timeval older;
  
  newer.tv_usec = tool_readbusy_cb_prev_1;
  newer.tv_sec = tool_readbusy_cb_prev_0;
  lVar1 = *(long *)((long)clientp + 0x10);
  if (*(char *)(lVar1 + 0x342) == '\x01') {
    if (tool_readbusy_cb::ulprev == ulnow) {
      newer = tvnow();
      if (tool_readbusy_cb_prev_0 != 0) {
        lVar5 = tool_readbusy_cb::rate + 3;
        if (-1 < tool_readbusy_cb::rate) {
          lVar5 = tool_readbusy_cb::rate;
        }
        older.tv_usec = tool_readbusy_cb_prev_1;
        older.tv_sec = tool_readbusy_cb_prev_0;
        lVar3 = tvdiff(newer,older);
        lVar4 = lVar3 + 3;
        if (-1 < lVar3) {
          lVar4 = lVar3;
        }
        tool_readbusy_cb::rate = ((lVar4 >> 2) - (lVar5 >> 2)) + tool_readbusy_cb::rate;
      }
      if (tool_readbusy_cb::rate < 0x32) {
        tool_readbusy_cb_prev_0 = newer.tv_sec;
        tool_readbusy_cb_prev_1 = newer.tv_usec;
        tool_go_sleep(0x19);
        goto LAB_0010c27e;
      }
    }
    else {
      tool_readbusy_cb::rate = 0x32;
      tool_readbusy_cb::ulprev = ulnow;
    }
    tool_readbusy_cb_prev_1 = newer.tv_usec;
    tool_readbusy_cb_prev_0 = newer.tv_sec;
    *(undefined1 *)(lVar1 + 0x342) = 0;
    curl_easy_pause(*(undefined8 *)((long)clientp + 0x20),0);
  }
LAB_0010c27e:
  iVar2 = 0x10000001;
  if (*(char *)((long)clientp + 0x1d9) != '\0') {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int tool_readbusy_cb(void *clientp,
                     curl_off_t dltotal, curl_off_t dlnow,
                     curl_off_t ultotal, curl_off_t ulnow)
{
  struct per_transfer *per = clientp;
  struct OperationConfig *config = per->config;

  (void)dltotal;  /* unused */
  (void)dlnow;  /* unused */
  (void)ultotal;  /* unused */
  (void)ulnow;  /* unused */

  if(config->readbusy) {
    /* lame code to keep the rate down because the input might not deliver
       anything, get paused again and come back here immediately */
    static long rate = 500;
    static struct timeval prev;
    static curl_off_t ulprev;

    if(ulprev == ulnow) {
      /* it did not upload anything since last call */
      struct timeval now = tvnow();
      if(prev.tv_sec)
        /* get a rolling average rate */
        /* rate = rate - rate/4 + tvdiff(now, prev)/4; */
        rate -= rate/4 - tvdiff(now, prev)/4;
      prev = now;
    }
    else {
      rate = 50;
      ulprev = ulnow;
    }
    if(rate >= 50) {
      /* keeps the looping down to 20 times per second in the crazy case */
      config->readbusy = FALSE;
      curl_easy_pause(per->curl, CURLPAUSE_CONT);
    }
    else
      /* sleep half a period */
      tool_go_sleep(25);
  }

  return per->noprogress ? 0 : CURL_PROGRESSFUNC_CONTINUE;
}